

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uint anon_unknown.dwarf_ff84f::AllocateGlobalVariable
               (ExpressionContext *ctx,SynBase *source,uint alignment,longlong size)

{
  ScopeData *pSVar1;
  ulong uVar2;
  uint uVar3;
  
  if ((alignment < 0x11) &&
     (uVar3 = alignment - (alignment >> 1 & 0x55555555),
     uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
     ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
    pSVar1 = ctx->globalScope;
    uVar3 = GetAlignmentOffset(pSVar1->dataSize,alignment);
    uVar2 = (ulong)uVar3 + pSVar1->dataSize;
    pSVar1->dataSize = uVar2;
    if ((long)((uVar2 & 0xffffffff) + size) < 0x1000001) {
      pSVar1->dataSize = size + uVar2;
      return (uint)uVar2;
    }
    ExpressionContext::Stop(ctx,source,"ERROR: variable size limit exceeded");
  }
  __assert_fail("(alignment & (alignment - 1)) == 0 && alignment <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x19a,
                "unsigned int (anonymous namespace)::AllocateGlobalVariable(ExpressionContext &, SynBase *, unsigned int, long long)"
               );
}

Assistant:

unsigned AllocateGlobalVariable(ExpressionContext &ctx, SynBase *source, unsigned alignment, long long size)
	{
		assert((alignment & (alignment - 1)) == 0 && alignment <= 16);

		ScopeData *scope = ctx.globalScope;

		scope->dataSize += GetAlignmentOffset(scope->dataSize, alignment);

		unsigned result = unsigned(scope->dataSize);

		if(result + size > (1 << 24))
			ctx.Stop(source, "ERROR: variable size limit exceeded");

		scope->dataSize += size;

		return result;
	}